

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  undefined8 *puVar2;
  RayQueryContext *k;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [16];
  vfloat<4> vVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  vbool<4> vVar15;
  bool bVar16;
  undefined4 uVar17;
  AABBNodeMB4D *node1;
  undefined1 *puVar18;
  RayQueryContext *pRVar19;
  ulong uVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  uint uVar23;
  ulong uVar24;
  RayQueryContext *pRVar25;
  RayQueryContext *pRVar26;
  long lVar27;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  NodeRef *pNVar30;
  int iVar31;
  float fVar32;
  float fVar33;
  float fVar51;
  float fVar52;
  vint4 ai;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar53;
  float fVar54;
  float fVar58;
  float fVar60;
  vint4 ai_3;
  undefined1 auVar55 [16];
  float fVar62;
  undefined1 auVar56 [16];
  float fVar59;
  float fVar61;
  undefined1 auVar57 [16];
  float fVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar66;
  float fVar67;
  float fVar69;
  float fVar71;
  float fVar73;
  vint4 ai_1;
  float fVar70;
  float fVar72;
  float fVar74;
  float fVar75;
  undefined1 auVar68 [16];
  float fVar76;
  float fVar77;
  uint uVar78;
  float fVar82;
  float fVar84;
  vint4 ai_2;
  float fVar86;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar83;
  uint uVar85;
  uint uVar87;
  undefined1 auVar81 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  vint4 bi;
  float fVar91;
  vint4 bi_3;
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  vint4 bi_1;
  float fVar98;
  float fVar99;
  uint uVar100;
  uint uVar101;
  uint uVar102;
  vint4 bi_2;
  uint uVar103;
  vfloat4 a0;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  vint4 bi_12;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar114;
  vint4 bi_9;
  float fVar115;
  float fVar116;
  float fVar117;
  vint4 ai_15;
  float fVar118;
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar14 = mm_lookupmask_ps._8_8_;
  uVar13 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar63 = *(undefined1 (*) [16])(ray + 0x80);
    auVar55._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar63._0_4_);
    auVar55._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar63._4_4_);
    auVar55._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar63._8_4_);
    auVar55._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar63._12_4_);
    uVar23 = movmskps((int)context,auVar55);
    if (uVar23 != 0) {
      uVar24 = (ulong)(uVar23 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar77 = tray.dir.field_0._0_4_;
      fVar82 = tray.dir.field_0._4_4_;
      fVar84 = tray.dir.field_0._8_4_;
      fVar86 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar53 = tray.dir.field_0._16_4_;
      fVar58 = tray.dir.field_0._20_4_;
      fVar60 = tray.dir.field_0._24_4_;
      fVar62 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar67 = tray.dir.field_0._32_4_;
      fVar69 = tray.dir.field_0._36_4_;
      fVar71 = tray.dir.field_0._40_4_;
      fVar74 = tray.dir.field_0._44_4_;
      auVar92._0_4_ = fVar53 * fVar53 + fVar67 * fVar67;
      auVar92._4_4_ = fVar58 * fVar58 + fVar69 * fVar69;
      auVar92._8_4_ = fVar60 * fVar60 + fVar71 * fVar71;
      auVar92._12_4_ = fVar62 * fVar62 + fVar74 * fVar74;
      auVar104._0_4_ = fVar77 * fVar77 + auVar92._0_4_;
      auVar104._4_4_ = fVar82 * fVar82 + auVar92._4_4_;
      auVar104._8_4_ = fVar84 * fVar84 + auVar92._8_4_;
      auVar104._12_4_ = fVar86 * fVar86 + auVar92._12_4_;
      auVar92 = rsqrtps(auVar92,auVar104);
      fVar91 = auVar92._0_4_;
      fVar32 = auVar92._4_4_;
      fVar33 = auVar92._8_4_;
      fVar51 = auVar92._12_4_;
      pre.depth_scale.field_0.v[0] = fVar91 * fVar91 * auVar104._0_4_ * -0.5 * fVar91 + fVar91 * 1.5
      ;
      pre.depth_scale.field_0.v[1] = fVar32 * fVar32 * auVar104._4_4_ * -0.5 * fVar32 + fVar32 * 1.5
      ;
      pre.depth_scale.field_0.v[2] = fVar33 * fVar33 * auVar104._8_4_ * -0.5 * fVar33 + fVar33 * 1.5
      ;
      pre.depth_scale.field_0.v[3] =
           fVar51 * fVar51 * auVar104._12_4_ * -0.5 * fVar51 + fVar51 * 1.5;
      while (uVar24 != 0) {
        lVar27 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
        auVar104 = insertps(ZEXT416(*(uint *)(ray + lVar27 * 4 + 0x40)),
                            *(undefined4 *)(ray + lVar27 * 4 + 0x50),0x1c);
        auVar104 = insertps(auVar104,*(undefined4 *)(ray + lVar27 * 4 + 0x60),0x28);
        fVar91 = *(float *)((long)pre.ray_space + lVar27 * 4 + -0x10);
        auVar105._0_4_ = auVar104._0_4_ * fVar91;
        auVar105._4_4_ = auVar104._4_4_ * fVar91;
        auVar105._8_4_ = auVar104._8_4_ * fVar91;
        auVar105._12_4_ = auVar104._12_4_ * fVar91;
        uVar20 = CONCAT44(auVar105._4_4_,auVar105._4_4_);
        auVar34._0_8_ = uVar20 ^ 0x8000000080000000;
        auVar34._8_4_ = -auVar105._12_4_;
        auVar34._12_4_ = -auVar105._12_4_;
        auVar104 = blendps(auVar34,ZEXT816(0),0xe);
        auVar113._4_4_ = auVar104._0_4_;
        auVar113._0_4_ = auVar105._8_4_;
        auVar113._8_4_ = auVar104._4_4_;
        auVar113._12_4_ = 0;
        auVar112._4_4_ = auVar104._0_4_;
        auVar112._0_4_ = auVar105._8_4_;
        auVar112._8_4_ = auVar104._4_4_;
        auVar112._12_4_ = 0;
        auVar112 = dpps(auVar112 << 0x20,auVar113 << 0x20,0x7f);
        uVar20 = CONCAT44(auVar105._12_4_,auVar105._8_4_);
        auVar107._0_8_ = uVar20 ^ 0x8000000080000000;
        auVar107._8_4_ = -auVar105._8_4_;
        auVar107._12_4_ = -auVar105._12_4_;
        auVar92 = insertps(auVar107,auVar105,0x2a);
        auVar104 = dpps(auVar92,auVar92,0x7f);
        iVar31 = -(uint)(auVar104._0_4_ < auVar112._0_4_);
        auVar35._4_4_ = iVar31;
        auVar35._0_4_ = iVar31;
        auVar35._8_4_ = iVar31;
        auVar35._12_4_ = iVar31;
        auVar104 = blendvps(auVar92,auVar113 << 0x20,auVar35);
        auVar92 = dpps(auVar104,auVar104,0x7f);
        auVar113 = rsqrtss(auVar92,auVar92);
        fVar32 = auVar113._0_4_;
        fVar32 = fVar32 * 1.5 - fVar32 * fVar32 * auVar92._0_4_ * 0.5 * fVar32;
        fVar33 = fVar32 * auVar104._0_4_;
        fVar51 = fVar32 * auVar104._4_4_;
        fVar52 = fVar32 * auVar104._8_4_;
        fVar32 = fVar32 * auVar104._12_4_;
        fVar106 = fVar51 * auVar105._0_4_ - auVar105._4_4_ * fVar33;
        fVar109 = fVar52 * auVar105._4_4_ - auVar105._8_4_ * fVar51;
        fVar110 = fVar33 * auVar105._8_4_ - auVar105._0_4_ * fVar52;
        auVar108._12_4_ = fVar32 * auVar105._12_4_ - auVar105._12_4_ * fVar32;
        auVar108._0_8_ = CONCAT44(fVar110,fVar109);
        auVar108._8_4_ = fVar106;
        auVar111._8_4_ = fVar106;
        auVar111._0_8_ = auVar108._0_8_;
        auVar111._12_4_ = auVar108._12_4_;
        auVar104 = dpps(auVar111,auVar108,0x7f);
        valid_i = (vint<4> *)(uVar24 - 1);
        uVar24 = uVar24 & (ulong)valid_i;
        auVar92 = rsqrtss(auVar104,auVar104);
        fVar32 = auVar92._0_4_;
        fVar32 = fVar32 * 1.5 - fVar32 * fVar32 * auVar104._0_4_ * 0.5 * fVar32;
        aVar36.m128[1] = fVar32 * fVar106;
        aVar36.m128[0] = fVar52;
        aVar36.m128[2] = auVar105._8_4_ * fVar91;
        aVar36.m128[3] = 0.0;
        pre.ray_space[lVar27].vx.field_0.m128[0] = fVar33;
        pre.ray_space[lVar27].vx.field_0.m128[1] = fVar32 * fVar109;
        pre.ray_space[lVar27].vx.field_0.m128[2] = auVar105._0_4_ * fVar91;
        pre.ray_space[lVar27].vx.field_0.m128[3] = 0.0;
        aVar10.m128[1] = fVar32 * fVar110;
        aVar10.m128[0] = fVar51;
        aVar10.m128[2] = auVar105._4_4_ * fVar91;
        aVar10.m128[3] = 0.0;
        pre.ray_space[lVar27].vy.field_0 = aVar10;
        pre.ray_space[lVar27].vz.field_0 = aVar36;
      }
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar91 = (float)DAT_01f4bd50;
      fVar32 = DAT_01f4bd50._4_4_;
      fVar33 = DAT_01f4bd50._8_4_;
      fVar51 = DAT_01f4bd50._12_4_;
      auVar37._4_4_ = -(uint)(ABS(fVar82) < fVar32);
      auVar37._0_4_ = -(uint)(ABS(fVar77) < fVar91);
      auVar37._8_4_ = -(uint)(ABS(fVar84) < fVar33);
      auVar37._12_4_ = -(uint)(ABS(fVar86) < fVar51);
      auVar112 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar37
                         );
      auVar38._4_4_ = -(uint)(ABS(fVar58) < fVar32);
      auVar38._0_4_ = -(uint)(ABS(fVar53) < fVar91);
      auVar38._8_4_ = -(uint)(ABS(fVar60) < fVar33);
      auVar38._12_4_ = -(uint)(ABS(fVar62) < fVar51);
      auVar92 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar38)
      ;
      auVar39._4_4_ = -(uint)(ABS(fVar69) < fVar32);
      auVar39._0_4_ = -(uint)(ABS(fVar67) < fVar91);
      auVar39._8_4_ = -(uint)(ABS(fVar71) < fVar33);
      auVar39._12_4_ = -(uint)(ABS(fVar74) < fVar51);
      auVar113 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar39
                         );
      auVar104 = rcpps(auVar39,auVar112);
      fVar53 = auVar104._0_4_;
      auVar79._0_4_ = auVar112._0_4_ * fVar53;
      fVar58 = auVar104._4_4_;
      auVar79._4_4_ = auVar112._4_4_ * fVar58;
      fVar60 = auVar104._8_4_;
      auVar79._8_4_ = auVar112._8_4_ * fVar60;
      fVar62 = auVar104._12_4_;
      auVar79._12_4_ = auVar112._12_4_ * fVar62;
      tray.rdir.field_0._0_4_ = (1.0 - auVar79._0_4_) * fVar53 + fVar53;
      tray.rdir.field_0._4_4_ = (1.0 - auVar79._4_4_) * fVar58 + fVar58;
      tray.rdir.field_0._8_4_ = (1.0 - auVar79._8_4_) * fVar60 + fVar60;
      tray.rdir.field_0._12_4_ = (1.0 - auVar79._12_4_) * fVar62 + fVar62;
      auVar104 = rcpps(auVar79,auVar92);
      fVar53 = auVar104._0_4_;
      fVar58 = auVar104._4_4_;
      fVar60 = auVar104._8_4_;
      fVar62 = auVar104._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar92._0_4_ * fVar53) * fVar53 + fVar53;
      tray.rdir.field_0._20_4_ = (1.0 - auVar92._4_4_ * fVar58) * fVar58 + fVar58;
      tray.rdir.field_0._24_4_ = (1.0 - auVar92._8_4_ * fVar60) * fVar60 + fVar60;
      tray.rdir.field_0._28_4_ = (1.0 - auVar92._12_4_ * fVar62) * fVar62 + fVar62;
      auVar104 = rcpps(auVar104,auVar113);
      fVar53 = auVar104._0_4_;
      fVar58 = auVar104._4_4_;
      fVar60 = auVar104._8_4_;
      fVar62 = auVar104._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar113._0_4_ * fVar53) * fVar53 + fVar53;
      tray.rdir.field_0._36_4_ = (1.0 - auVar113._4_4_ * fVar58) * fVar58 + fVar58;
      tray.rdir.field_0._40_4_ = (1.0 - auVar113._8_4_ * fVar60) * fVar60 + fVar60;
      tray.rdir.field_0._44_4_ = (1.0 - auVar113._12_4_ * fVar62) * fVar62 + fVar62;
      auVar80._0_12_ = ZEXT812(0);
      auVar80._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar40._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar40._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar40._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar40._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar40);
      auVar41._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar41._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar41._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar41._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar41);
      auVar104 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar80);
      auVar63 = maxps(auVar63,auVar80);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar104,auVar55);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar63,auVar55);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar63 ^ auVar55);
      if (context->user == (RTCRayQueryContext *)0x0) {
        pRVar26 = (RayQueryContext *)0x3;
        pRVar25 = (RayQueryContext *)0x0;
      }
      else {
        pRVar25 = (RayQueryContext *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        pRVar26 = (RayQueryContext *)((ulong)((char)pRVar25 == '\0') + 2);
      }
      pNVar30 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = sVar1;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      puVar18 = mm_lookupmask_ps;
      paVar28 = &stack_near[2].field_0;
      aVar114 = _DAT_01f45a30;
LAB_006d2b6a:
      do {
        do {
          root.ptr = pNVar30[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006d334e;
          pNVar30 = pNVar30 + -1;
          paVar29 = paVar28 + -1;
          local_1948 = paVar29->v[0];
          fStack_1944 = *(float *)((long)paVar28 + -0xc);
          fStack_1940 = *(float *)((long)paVar28 + -8);
          fStack_193c = *(float *)((long)paVar28 + -4);
          vVar12.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar29->v;
          auVar42._4_4_ = -(uint)(fStack_1944 < tray.tfar.field_0.v[1]);
          auVar42._0_4_ = -(uint)(local_1948 < tray.tfar.field_0.v[0]);
          auVar42._8_4_ = -(uint)(fStack_1940 < tray.tfar.field_0.v[2]);
          auVar42._12_4_ = -(uint)(fStack_193c < tray.tfar.field_0.v[3]);
          uVar23 = movmskps((int)puVar18,auVar42);
          puVar18 = (undefined1 *)(ulong)uVar23;
          paVar28 = paVar29;
        } while (uVar23 == 0);
        uVar24 = (ulong)(byte)uVar23;
        pRVar19 = (RayQueryContext *)(ulong)(uint)POPCOUNT(uVar23 & 0xff);
        puVar18 = (undefined1 *)pRVar19;
        if (pRVar26 < pRVar19) {
LAB_006d2bad:
          vVar15.field_0 = terminated.field_0;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006d334e;
              auVar49._4_4_ = -(uint)(fStack_1944 < tray.tfar.field_0.v[1]);
              auVar49._0_4_ = -(uint)(local_1948 < tray.tfar.field_0.v[0]);
              auVar49._8_4_ = -(uint)(fStack_1940 < tray.tfar.field_0.v[2]);
              auVar49._12_4_ = -(uint)(fStack_193c < tray.tfar.field_0.v[3]);
              uVar23 = movmskps((int)puVar18,auVar49);
              puVar18 = (undefined1 *)(ulong)uVar23;
              paVar28 = paVar29;
              if (uVar23 != 0) {
                pRVar25 = (RayQueryContext *)This->leafIntersector;
                valid_o.field_0._0_8_ = uVar13;
                valid_o.field_0._8_8_ = uVar14;
                uVar23 = movmskps((int)uVar24,(undefined1  [16])terminated.field_0);
                uVar24 = (ulong)(uVar23 ^ 0xf);
                puVar21 = (undefined8 *)
                          ((long)pRVar25 +
                          (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x18);
                puVar22 = puVar21;
                while (uVar24 != 0) {
                  puVar2 = (undefined8 *)0x0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> (long)puVar2 & 1) == 0;
                        puVar2 = (undefined8 *)((long)puVar2 + 1)) {
                    }
                  }
                  uVar24 = uVar24 & uVar24 - 1;
                  valid_i = (vint<4> *)&pre;
                  pRVar25 = context;
                  puVar22 = (undefined8 *)
                            (*(code *)*puVar21)(valid_i,ray,puVar2,context,
                                                (byte *)(root.ptr & 0xfffffffffffffff0));
                  aVar114 = _DAT_01f45a30;
                  if ((char)puVar22 != '\0') {
                    valid_o.field_0.i[(long)puVar2] = -1;
                    puVar22 = puVar2;
                  }
                }
                auVar11._8_8_ = valid_o.field_0._8_8_;
                auVar11._0_8_ = valid_o.field_0._0_8_;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])vVar15.field_0 | auVar11);
                uVar23 = movmskps((int)puVar22,(undefined1  [16])terminated.field_0);
                puVar18 = (undefined1 *)(ulong)uVar23;
                if (uVar23 == 0xf) goto LAB_006d334e;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_006d2b6a;
            }
            uVar20 = root.ptr & 0xfffffffffffffff0;
            uVar23 = (uint)root.ptr & 7;
            pRVar25 = (RayQueryContext *)(ulong)uVar23;
            bVar16 = local_1948 < tray.tfar.field_0.v[0];
            bVar7 = fStack_1944 < tray.tfar.field_0.v[1];
            bVar8 = fStack_1940 < tray.tfar.field_0.v[2];
            bVar9 = fStack_193c < tray.tfar.field_0.v[3];
            local_1948 = aVar114.v[0];
            fStack_1944 = aVar114.v[1];
            fStack_1940 = aVar114.v[2];
            fStack_193c = aVar114.v[3];
            root.ptr = 8;
            for (lVar27 = -0x10;
                (lVar27 != 0 && (sVar1 = *(size_t *)(uVar20 + 0x20 + lVar27 * 2), sVar1 != 8));
                lVar27 = lVar27 + 4) {
              if ((uVar23 == 6) || (uVar23 == 1)) {
                fVar53 = *(float *)(uVar20 + 0x90 + lVar27);
                fVar58 = *(float *)(uVar20 + 0x30 + lVar27);
                fVar60 = *(float *)(uVar20 + 0x40 + lVar27);
                fVar62 = *(float *)(uVar20 + 0x50 + lVar27);
                fVar67 = *(float *)(uVar20 + 0x60 + lVar27);
                auVar63 = *(undefined1 (*) [16])(ray + 0x70);
                fVar51 = auVar63._0_4_;
                fVar52 = auVar63._4_4_;
                fVar106 = auVar63._8_4_;
                fVar109 = auVar63._12_4_;
                fVar69 = *(float *)(uVar20 + 0xb0 + lVar27);
                fVar71 = *(float *)(uVar20 + 0xd0 + lVar27);
                fVar74 = *(float *)(uVar20 + 0x70 + lVar27);
                fVar77 = *(float *)(uVar20 + 0xa0 + lVar27);
                fVar82 = *(float *)(uVar20 + 0xc0 + lVar27);
                fVar84 = *(float *)(uVar20 + 0xe0 + lVar27);
                fVar86 = *(float *)(uVar20 + 0x80 + lVar27);
                fVar91 = ((fVar53 * fVar51 + fVar58) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar32 = ((fVar53 * fVar52 + fVar58) - (float)tray.org.field_0._4_4_) *
                         (float)tray.rdir.field_0._4_4_;
                fVar33 = ((fVar53 * fVar106 + fVar58) - (float)tray.org.field_0._8_4_) *
                         (float)tray.rdir.field_0._8_4_;
                fVar53 = ((fVar53 * fVar109 + fVar58) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar110 = ((fVar69 * fVar51 + fVar62) - (float)tray.org.field_0._16_4_) *
                          (float)tray.rdir.field_0._16_4_;
                fVar70 = ((fVar69 * fVar52 + fVar62) - (float)tray.org.field_0._20_4_) *
                         (float)tray.rdir.field_0._20_4_;
                fVar72 = ((fVar69 * fVar106 + fVar62) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar75 = ((fVar69 * fVar109 + fVar62) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar58 = ((fVar71 * fVar51 + fVar74) - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar62 = ((fVar71 * fVar52 + fVar74) - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar69 = ((fVar71 * fVar106 + fVar74) - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar71 = ((fVar71 * fVar109 + fVar74) - (float)tray.org.field_0._44_4_) *
                         (float)tray.rdir.field_0._44_4_;
                fVar74 = ((fVar77 * fVar51 + fVar60) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar89 = ((fVar77 * fVar52 + fVar60) - (float)tray.org.field_0._4_4_) *
                         (float)tray.rdir.field_0._4_4_;
                fVar90 = ((fVar77 * fVar106 + fVar60) - (float)tray.org.field_0._8_4_) *
                         (float)tray.rdir.field_0._8_4_;
                fVar60 = ((fVar77 * fVar109 + fVar60) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar93 = ((fVar82 * fVar51 + fVar67) - (float)tray.org.field_0._16_4_) *
                         (float)tray.rdir.field_0._16_4_;
                fVar94 = ((fVar82 * fVar52 + fVar67) - (float)tray.org.field_0._20_4_) *
                         (float)tray.rdir.field_0._20_4_;
                fVar96 = ((fVar82 * fVar106 + fVar67) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar98 = ((fVar82 * fVar109 + fVar67) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar67 = ((fVar84 * fVar51 + fVar86) - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar77 = ((fVar84 * fVar52 + fVar86) - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar82 = ((fVar84 * fVar106 + fVar86) - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar84 = ((fVar84 * fVar109 + fVar86) - (float)tray.org.field_0._44_4_) *
                         (float)tray.rdir.field_0._44_4_;
                uVar78 = (uint)((int)fVar74 < (int)fVar91) * (int)fVar74 |
                         (uint)((int)fVar74 >= (int)fVar91) * (int)fVar91;
                uVar83 = (uint)((int)fVar89 < (int)fVar32) * (int)fVar89 |
                         (uint)((int)fVar89 >= (int)fVar32) * (int)fVar32;
                uVar85 = (uint)((int)fVar90 < (int)fVar33) * (int)fVar90 |
                         (uint)((int)fVar90 >= (int)fVar33) * (int)fVar33;
                uVar87 = (uint)((int)fVar60 < (int)fVar53) * (int)fVar60 |
                         (uint)((int)fVar60 >= (int)fVar53) * (int)fVar53;
                uVar100 = (uint)((int)fVar93 < (int)fVar110) * (int)fVar93 |
                          (uint)((int)fVar93 >= (int)fVar110) * (int)fVar110;
                uVar101 = (uint)((int)fVar94 < (int)fVar70) * (int)fVar94 |
                          (uint)((int)fVar94 >= (int)fVar70) * (int)fVar70;
                uVar102 = (uint)((int)fVar96 < (int)fVar72) * (int)fVar96 |
                          (uint)((int)fVar96 >= (int)fVar72) * (int)fVar72;
                uVar103 = (uint)((int)fVar98 < (int)fVar75) * (int)fVar98 |
                          (uint)((int)fVar98 >= (int)fVar75) * (int)fVar75;
                uVar100 = ((int)uVar100 < (int)uVar78) * uVar78 |
                          ((int)uVar100 >= (int)uVar78) * uVar100;
                uVar101 = ((int)uVar101 < (int)uVar83) * uVar83 |
                          ((int)uVar101 >= (int)uVar83) * uVar101;
                uVar102 = ((int)uVar102 < (int)uVar85) * uVar85 |
                          ((int)uVar102 >= (int)uVar85) * uVar102;
                uVar103 = ((int)uVar103 < (int)uVar87) * uVar87 |
                          ((int)uVar103 >= (int)uVar87) * uVar103;
                uVar78 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar67 |
                         (uint)((int)fVar67 >= (int)fVar58) * (int)fVar58;
                uVar83 = (uint)((int)fVar77 < (int)fVar62) * (int)fVar77 |
                         (uint)((int)fVar77 >= (int)fVar62) * (int)fVar62;
                uVar85 = (uint)((int)fVar82 < (int)fVar69) * (int)fVar82 |
                         (uint)((int)fVar82 >= (int)fVar69) * (int)fVar69;
                uVar87 = (uint)((int)fVar84 < (int)fVar71) * (int)fVar84 |
                         (uint)((int)fVar84 >= (int)fVar71) * (int)fVar71;
                auVar81._0_4_ =
                     ((int)uVar78 < (int)uVar100) * uVar100 | ((int)uVar78 >= (int)uVar100) * uVar78
                ;
                auVar81._4_4_ =
                     ((int)uVar83 < (int)uVar101) * uVar101 | ((int)uVar83 >= (int)uVar101) * uVar83
                ;
                auVar81._8_4_ =
                     ((int)uVar85 < (int)uVar102) * uVar102 | ((int)uVar85 >= (int)uVar102) * uVar85
                ;
                auVar81._12_4_ =
                     ((int)uVar87 < (int)uVar103) * uVar103 | ((int)uVar87 >= (int)uVar103) * uVar87
                ;
                uVar78 = (uint)((int)fVar74 < (int)fVar91) * (int)fVar91 |
                         (uint)((int)fVar74 >= (int)fVar91) * (int)fVar74;
                uVar83 = (uint)((int)fVar89 < (int)fVar32) * (int)fVar32 |
                         (uint)((int)fVar89 >= (int)fVar32) * (int)fVar89;
                uVar85 = (uint)((int)fVar90 < (int)fVar33) * (int)fVar33 |
                         (uint)((int)fVar90 >= (int)fVar33) * (int)fVar90;
                uVar87 = (uint)((int)fVar60 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar60 >= (int)fVar53) * (int)fVar60;
                uVar100 = (uint)((int)fVar93 < (int)fVar110) * (int)fVar110 |
                          (uint)((int)fVar93 >= (int)fVar110) * (int)fVar93;
                uVar101 = (uint)((int)fVar94 < (int)fVar70) * (int)fVar70 |
                          (uint)((int)fVar94 >= (int)fVar70) * (int)fVar94;
                uVar102 = (uint)((int)fVar96 < (int)fVar72) * (int)fVar72 |
                          (uint)((int)fVar96 >= (int)fVar72) * (int)fVar96;
                uVar103 = (uint)((int)fVar98 < (int)fVar75) * (int)fVar75 |
                          (uint)((int)fVar98 >= (int)fVar75) * (int)fVar98;
                uVar100 = ((int)uVar78 < (int)uVar100) * uVar78 |
                          ((int)uVar78 >= (int)uVar100) * uVar100;
                uVar101 = ((int)uVar83 < (int)uVar101) * uVar83 |
                          ((int)uVar83 >= (int)uVar101) * uVar101;
                uVar102 = ((int)uVar85 < (int)uVar102) * uVar85 |
                          ((int)uVar85 >= (int)uVar102) * uVar102;
                uVar103 = ((int)uVar87 < (int)uVar103) * uVar87 |
                          ((int)uVar87 >= (int)uVar103) * uVar103;
                uVar78 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar58 |
                         (uint)((int)fVar67 >= (int)fVar58) * (int)fVar67;
                uVar83 = (uint)((int)fVar77 < (int)fVar62) * (int)fVar62 |
                         (uint)((int)fVar77 >= (int)fVar62) * (int)fVar77;
                uVar85 = (uint)((int)fVar82 < (int)fVar69) * (int)fVar69 |
                         (uint)((int)fVar82 >= (int)fVar69) * (int)fVar82;
                uVar87 = (uint)((int)fVar84 < (int)fVar71) * (int)fVar71 |
                         (uint)((int)fVar84 >= (int)fVar71) * (int)fVar84;
                uVar78 = ((int)uVar100 < (int)uVar78) * uVar100 |
                         ((int)uVar100 >= (int)uVar78) * uVar78;
                uVar83 = ((int)uVar101 < (int)uVar83) * uVar101 |
                         ((int)uVar101 >= (int)uVar83) * uVar83;
                uVar85 = ((int)uVar102 < (int)uVar85) * uVar102 |
                         ((int)uVar102 >= (int)uVar85) * uVar85;
                uVar87 = ((int)uVar103 < (int)uVar87) * uVar103 |
                         ((int)uVar103 >= (int)uVar87) * uVar87;
                bVar3 = (float)((tray.tnear.field_0.i[0] < (int)auVar81._0_4_) * auVar81._0_4_ |
                               (uint)(tray.tnear.field_0.i[0] >= (int)auVar81._0_4_) *
                               tray.tnear.field_0.i[0]) <=
                        (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar78) *
                                tray.tfar.field_0.i[0] |
                               (tray.tfar.field_0.i[0] >= (int)uVar78) * uVar78);
                uVar78 = -(uint)bVar3;
                bVar4 = (float)((tray.tnear.field_0.i[1] < (int)auVar81._4_4_) * auVar81._4_4_ |
                               (uint)(tray.tnear.field_0.i[1] >= (int)auVar81._4_4_) *
                               tray.tnear.field_0.i[1]) <=
                        (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar83) *
                                tray.tfar.field_0.i[1] |
                               (tray.tfar.field_0.i[1] >= (int)uVar83) * uVar83);
                uVar83 = -(uint)bVar4;
                bVar5 = (float)((tray.tnear.field_0.i[2] < (int)auVar81._8_4_) * auVar81._8_4_ |
                               (uint)(tray.tnear.field_0.i[2] >= (int)auVar81._8_4_) *
                               tray.tnear.field_0.i[2]) <=
                        (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar85) *
                                tray.tfar.field_0.i[2] |
                               (tray.tfar.field_0.i[2] >= (int)uVar85) * uVar85);
                uVar85 = -(uint)bVar5;
                bVar6 = (float)((tray.tnear.field_0.i[3] < (int)auVar81._12_4_) * auVar81._12_4_ |
                               (uint)(tray.tnear.field_0.i[3] >= (int)auVar81._12_4_) *
                               tray.tnear.field_0.i[3]) <=
                        (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar87) *
                                tray.tfar.field_0.i[3] |
                               (tray.tfar.field_0.i[3] >= (int)uVar87) * uVar87);
                uVar87 = -(uint)bVar6;
                if (uVar23 == 6) {
                  fVar53 = *(float *)(uVar20 + 0xf0 + lVar27);
                  fVar58 = *(float *)(uVar20 + 0x100 + lVar27);
                  uVar78 = -(uint)((fVar51 < fVar58 && fVar53 <= fVar51) && bVar3);
                  uVar83 = -(uint)((fVar52 < fVar58 && fVar53 <= fVar52) && bVar4);
                  uVar85 = -(uint)((fVar106 < fVar58 && fVar53 <= fVar106) && bVar5);
                  uVar87 = -(uint)((fVar109 < fVar58 && fVar53 <= fVar109) && bVar6);
                }
              }
              else {
                fVar53 = *(float *)(uVar20 + 0x30 + lVar27);
                fVar58 = *(float *)(uVar20 + 0x40 + lVar27);
                fVar60 = *(float *)(uVar20 + 0x50 + lVar27);
                fVar62 = *(float *)(uVar20 + 0x60 + lVar27);
                fVar67 = *(float *)(uVar20 + 0x70 + lVar27);
                fVar69 = *(float *)(uVar20 + 0x80 + lVar27);
                fVar71 = *(float *)(uVar20 + 0x90 + lVar27);
                fVar74 = *(float *)(uVar20 + 0xa0 + lVar27);
                fVar77 = *(float *)(uVar20 + 0xb0 + lVar27);
                fVar82 = *(float *)(uVar20 + 0xf0 + lVar27);
                fVar84 = *(float *)(uVar20 + 0x100 + lVar27);
                auVar68._0_4_ =
                     fVar53 * (float)tray.dir.field_0._0_4_ +
                     fVar62 * (float)tray.dir.field_0._16_4_ +
                     fVar71 * (float)tray.dir.field_0._32_4_;
                auVar68._4_4_ =
                     fVar53 * (float)tray.dir.field_0._4_4_ +
                     fVar62 * (float)tray.dir.field_0._20_4_ +
                     fVar71 * (float)tray.dir.field_0._36_4_;
                auVar68._8_4_ =
                     fVar53 * (float)tray.dir.field_0._8_4_ +
                     fVar62 * (float)tray.dir.field_0._24_4_ +
                     fVar71 * (float)tray.dir.field_0._40_4_;
                auVar68._12_4_ =
                     fVar53 * (float)tray.dir.field_0._12_4_ +
                     fVar62 * (float)tray.dir.field_0._28_4_ +
                     fVar71 * (float)tray.dir.field_0._44_4_;
                auVar64._0_4_ =
                     fVar58 * (float)tray.dir.field_0._0_4_ +
                     fVar67 * (float)tray.dir.field_0._16_4_ +
                     fVar74 * (float)tray.dir.field_0._32_4_;
                auVar64._4_4_ =
                     fVar58 * (float)tray.dir.field_0._4_4_ +
                     fVar67 * (float)tray.dir.field_0._20_4_ +
                     fVar74 * (float)tray.dir.field_0._36_4_;
                auVar64._8_4_ =
                     fVar58 * (float)tray.dir.field_0._8_4_ +
                     fVar67 * (float)tray.dir.field_0._24_4_ +
                     fVar74 * (float)tray.dir.field_0._40_4_;
                auVar64._12_4_ =
                     fVar58 * (float)tray.dir.field_0._12_4_ +
                     fVar67 * (float)tray.dir.field_0._28_4_ +
                     fVar74 * (float)tray.dir.field_0._44_4_;
                fVar86 = *(float *)(uVar20 + 0x110 + lVar27);
                auVar56._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar60 +
                     (float)tray.dir.field_0._16_4_ * fVar69 +
                     (float)tray.dir.field_0._32_4_ * fVar77;
                auVar56._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar60 +
                     (float)tray.dir.field_0._20_4_ * fVar69 +
                     (float)tray.dir.field_0._36_4_ * fVar77;
                auVar56._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar60 +
                     (float)tray.dir.field_0._24_4_ * fVar69 +
                     (float)tray.dir.field_0._40_4_ * fVar77;
                auVar56._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar60 +
                     (float)tray.dir.field_0._28_4_ * fVar69 +
                     (float)tray.dir.field_0._44_4_ * fVar77;
                fVar91 = (float)DAT_01f4bd50;
                fVar32 = DAT_01f4bd50._4_4_;
                fVar33 = DAT_01f4bd50._8_4_;
                fVar51 = DAT_01f4bd50._12_4_;
                auVar43._4_4_ = -(uint)(ABS(auVar68._4_4_) < fVar32);
                auVar43._0_4_ = -(uint)(ABS(auVar68._0_4_) < fVar91);
                auVar43._8_4_ = -(uint)(ABS(auVar68._8_4_) < fVar33);
                auVar43._12_4_ = -(uint)(ABS(auVar68._12_4_) < fVar51);
                auVar113 = blendvps(auVar68,_DAT_01f4bd50,auVar43);
                auVar44._4_4_ = -(uint)(ABS(auVar64._4_4_) < fVar32);
                auVar44._0_4_ = -(uint)(ABS(auVar64._0_4_) < fVar91);
                auVar44._8_4_ = -(uint)(ABS(auVar64._8_4_) < fVar33);
                auVar44._12_4_ = -(uint)(ABS(auVar64._12_4_) < fVar51);
                auVar92 = blendvps(auVar64,_DAT_01f4bd50,auVar44);
                auVar45._4_4_ = -(uint)(ABS(auVar56._4_4_) < fVar32);
                auVar45._0_4_ = -(uint)(ABS(auVar56._0_4_) < fVar91);
                auVar45._8_4_ = -(uint)(ABS(auVar56._8_4_) < fVar33);
                auVar45._12_4_ = -(uint)(ABS(auVar56._12_4_) < fVar51);
                auVar104 = blendvps(auVar56,_DAT_01f4bd50,auVar45);
                fVar91 = *(float *)(uVar20 + 0x120 + lVar27);
                fVar32 = *(float *)(uVar20 + 0x130 + lVar27);
                fVar33 = *(float *)(uVar20 + 0x140 + lVar27);
                fVar109 = *(float *)(ray + 0x70);
                fVar110 = *(float *)(ray + 0x74);
                fVar70 = *(float *)(ray + 0x78);
                fVar72 = *(float *)(ray + 0x7c);
                auVar46._0_4_ = 1.0 - fVar109;
                auVar46._4_4_ = 1.0 - fVar110;
                auVar46._8_4_ = 1.0 - fVar70;
                auVar46._12_4_ = 1.0 - fVar72;
                fVar115 = auVar46._0_4_ * 0.0;
                fVar116 = auVar46._4_4_ * 0.0;
                fVar117 = auVar46._8_4_ * 0.0;
                fVar118 = auVar46._12_4_ * 0.0;
                auVar63 = rcpps(auVar46,auVar113);
                fVar75 = auVar63._0_4_;
                fVar93 = auVar63._4_4_;
                fVar98 = auVar63._8_4_;
                fVar88 = auVar63._12_4_;
                fVar75 = (1.0 - auVar113._0_4_ * fVar75) * fVar75 + fVar75;
                fVar93 = (1.0 - auVar113._4_4_ * fVar93) * fVar93 + fVar93;
                fVar98 = (1.0 - auVar113._8_4_ * fVar98) * fVar98 + fVar98;
                fVar88 = (1.0 - auVar113._12_4_ * fVar88) * fVar88 + fVar88;
                auVar63 = rcpps(auVar63,auVar92);
                fVar89 = auVar63._0_4_;
                fVar94 = auVar63._4_4_;
                fVar73 = auVar63._8_4_;
                fVar76 = auVar63._12_4_;
                fVar89 = (1.0 - auVar92._0_4_ * fVar89) * fVar89 + fVar89;
                fVar94 = (1.0 - auVar92._4_4_ * fVar94) * fVar94 + fVar94;
                fVar73 = (1.0 - auVar92._8_4_ * fVar73) * fVar73 + fVar73;
                fVar76 = (1.0 - auVar92._12_4_ * fVar76) * fVar76 + fVar76;
                auVar63 = rcpps(auVar63,auVar104);
                fVar90 = auVar63._0_4_;
                fVar96 = auVar63._4_4_;
                fVar65 = auVar63._8_4_;
                fVar66 = auVar63._12_4_;
                fVar90 = (1.0 - auVar104._0_4_ * fVar90) * fVar90 + fVar90;
                fVar96 = (1.0 - auVar104._4_4_ * fVar96) * fVar96 + fVar96;
                fVar65 = (1.0 - auVar104._8_4_ * fVar65) * fVar65 + fVar65;
                fVar66 = (1.0 - auVar104._12_4_ * fVar66) * fVar66 + fVar66;
                fVar51 = *(float *)(uVar20 + 0xc0 + lVar27);
                fVar52 = *(float *)(uVar20 + 0xd0 + lVar27);
                fVar106 = *(float *)(uVar20 + 0xe0 + lVar27);
                fVar54 = fVar53 * (float)tray.org.field_0._0_4_ +
                         fVar62 * (float)tray.org.field_0._16_4_ +
                         fVar71 * (float)tray.org.field_0._32_4_ + fVar51;
                fVar59 = fVar53 * (float)tray.org.field_0._4_4_ +
                         fVar62 * (float)tray.org.field_0._20_4_ +
                         fVar71 * (float)tray.org.field_0._36_4_ + fVar51;
                fVar61 = fVar53 * (float)tray.org.field_0._8_4_ +
                         fVar62 * (float)tray.org.field_0._24_4_ +
                         fVar71 * (float)tray.org.field_0._40_4_ + fVar51;
                fVar51 = fVar53 * (float)tray.org.field_0._12_4_ +
                         fVar62 * (float)tray.org.field_0._28_4_ +
                         fVar71 * (float)tray.org.field_0._44_4_ + fVar51;
                fVar53 = fVar58 * (float)tray.org.field_0._0_4_ +
                         fVar67 * (float)tray.org.field_0._16_4_ +
                         fVar74 * (float)tray.org.field_0._32_4_ + fVar52;
                fVar62 = fVar58 * (float)tray.org.field_0._4_4_ +
                         fVar67 * (float)tray.org.field_0._20_4_ +
                         fVar74 * (float)tray.org.field_0._36_4_ + fVar52;
                fVar71 = fVar58 * (float)tray.org.field_0._8_4_ +
                         fVar67 * (float)tray.org.field_0._24_4_ +
                         fVar74 * (float)tray.org.field_0._40_4_ + fVar52;
                fVar52 = fVar58 * (float)tray.org.field_0._12_4_ +
                         fVar67 * (float)tray.org.field_0._28_4_ +
                         fVar74 * (float)tray.org.field_0._44_4_ + fVar52;
                fVar58 = fVar60 * (float)tray.org.field_0._0_4_ +
                         fVar69 * (float)tray.org.field_0._16_4_ +
                         fVar77 * (float)tray.org.field_0._32_4_ + fVar106;
                fVar67 = fVar60 * (float)tray.org.field_0._4_4_ +
                         fVar69 * (float)tray.org.field_0._20_4_ +
                         fVar77 * (float)tray.org.field_0._36_4_ + fVar106;
                fVar74 = fVar60 * (float)tray.org.field_0._8_4_ +
                         fVar69 * (float)tray.org.field_0._24_4_ +
                         fVar77 * (float)tray.org.field_0._40_4_ + fVar106;
                fVar60 = fVar60 * (float)tray.org.field_0._12_4_ +
                         fVar69 * (float)tray.org.field_0._28_4_ +
                         fVar77 * (float)tray.org.field_0._44_4_ + fVar106;
                fVar106 = ((fVar82 * fVar109 + fVar115) - fVar54) * fVar75;
                fVar95 = ((fVar82 * fVar110 + fVar116) - fVar59) * fVar93;
                fVar97 = ((fVar82 * fVar70 + fVar117) - fVar61) * fVar98;
                fVar99 = ((fVar82 * fVar72 + fVar118) - fVar51) * fVar88;
                fVar75 = ((fVar91 * fVar109 + auVar46._0_4_) - fVar54) * fVar75;
                fVar93 = ((fVar91 * fVar110 + auVar46._4_4_) - fVar59) * fVar93;
                fVar98 = ((fVar91 * fVar70 + auVar46._8_4_) - fVar61) * fVar98;
                fVar88 = ((fVar91 * fVar72 + auVar46._12_4_) - fVar51) * fVar88;
                fVar69 = ((fVar84 * fVar109 + fVar115) - fVar53) * fVar89;
                fVar77 = ((fVar84 * fVar110 + fVar116) - fVar62) * fVar94;
                fVar82 = ((fVar84 * fVar70 + fVar117) - fVar71) * fVar73;
                fVar84 = ((fVar84 * fVar72 + fVar118) - fVar52) * fVar76;
                fVar89 = ((fVar32 * fVar109 + auVar46._0_4_) - fVar53) * fVar89;
                fVar94 = ((fVar32 * fVar110 + auVar46._4_4_) - fVar62) * fVar94;
                fVar73 = ((fVar32 * fVar70 + auVar46._8_4_) - fVar71) * fVar73;
                fVar76 = ((fVar32 * fVar72 + auVar46._12_4_) - fVar52) * fVar76;
                fVar53 = ((fVar115 + fVar86 * fVar109) - fVar58) * fVar90;
                fVar62 = ((fVar116 + fVar86 * fVar110) - fVar67) * fVar96;
                fVar71 = ((fVar117 + fVar86 * fVar70) - fVar74) * fVar65;
                fVar86 = ((fVar118 + fVar86 * fVar72) - fVar60) * fVar66;
                fVar90 = ((fVar33 * fVar109 + auVar46._0_4_) - fVar58) * fVar90;
                fVar96 = ((fVar33 * fVar110 + auVar46._4_4_) - fVar67) * fVar96;
                fVar65 = ((fVar33 * fVar70 + auVar46._8_4_) - fVar74) * fVar65;
                fVar66 = ((fVar33 * fVar72 + auVar46._12_4_) - fVar60) * fVar66;
                uVar78 = (uint)((int)fVar75 < (int)fVar106) * (int)fVar75 |
                         (uint)((int)fVar75 >= (int)fVar106) * (int)fVar106;
                uVar83 = (uint)((int)fVar93 < (int)fVar95) * (int)fVar93 |
                         (uint)((int)fVar93 >= (int)fVar95) * (int)fVar95;
                uVar85 = (uint)((int)fVar98 < (int)fVar97) * (int)fVar98 |
                         (uint)((int)fVar98 >= (int)fVar97) * (int)fVar97;
                uVar87 = (uint)((int)fVar88 < (int)fVar99) * (int)fVar88 |
                         (uint)((int)fVar88 >= (int)fVar99) * (int)fVar99;
                uVar100 = (uint)((int)fVar89 < (int)fVar69) * (int)fVar89 |
                          (uint)((int)fVar89 >= (int)fVar69) * (int)fVar69;
                uVar101 = (uint)((int)fVar94 < (int)fVar77) * (int)fVar94 |
                          (uint)((int)fVar94 >= (int)fVar77) * (int)fVar77;
                uVar102 = (uint)((int)fVar73 < (int)fVar82) * (int)fVar73 |
                          (uint)((int)fVar73 >= (int)fVar82) * (int)fVar82;
                uVar103 = (uint)((int)fVar76 < (int)fVar84) * (int)fVar76 |
                          (uint)((int)fVar76 >= (int)fVar84) * (int)fVar84;
                uVar78 = ((int)uVar100 < (int)uVar78) * uVar78 |
                         ((int)uVar100 >= (int)uVar78) * uVar100;
                uVar83 = ((int)uVar101 < (int)uVar83) * uVar83 |
                         ((int)uVar101 >= (int)uVar83) * uVar101;
                uVar85 = ((int)uVar102 < (int)uVar85) * uVar85 |
                         ((int)uVar102 >= (int)uVar85) * uVar102;
                uVar87 = ((int)uVar103 < (int)uVar87) * uVar87 |
                         ((int)uVar103 >= (int)uVar87) * uVar103;
                uVar100 = (uint)((int)fVar90 < (int)fVar53) * (int)fVar90 |
                          (uint)((int)fVar90 >= (int)fVar53) * (int)fVar53;
                uVar101 = (uint)((int)fVar96 < (int)fVar62) * (int)fVar96 |
                          (uint)((int)fVar96 >= (int)fVar62) * (int)fVar62;
                uVar102 = (uint)((int)fVar65 < (int)fVar71) * (int)fVar65 |
                          (uint)((int)fVar65 >= (int)fVar71) * (int)fVar71;
                uVar103 = (uint)((int)fVar66 < (int)fVar86) * (int)fVar66 |
                          (uint)((int)fVar66 >= (int)fVar86) * (int)fVar86;
                auVar81._0_4_ =
                     ((int)uVar100 < (int)uVar78) * uVar78 | ((int)uVar100 >= (int)uVar78) * uVar100
                ;
                auVar81._4_4_ =
                     ((int)uVar101 < (int)uVar83) * uVar83 | ((int)uVar101 >= (int)uVar83) * uVar101
                ;
                auVar81._8_4_ =
                     ((int)uVar102 < (int)uVar85) * uVar85 | ((int)uVar102 >= (int)uVar85) * uVar102
                ;
                auVar81._12_4_ =
                     ((int)uVar103 < (int)uVar87) * uVar87 | ((int)uVar103 >= (int)uVar87) * uVar103
                ;
                uVar100 = (uint)((int)fVar75 < (int)fVar106) * (int)fVar106 |
                          (uint)((int)fVar75 >= (int)fVar106) * (int)fVar75;
                uVar101 = (uint)((int)fVar93 < (int)fVar95) * (int)fVar95 |
                          (uint)((int)fVar93 >= (int)fVar95) * (int)fVar93;
                uVar102 = (uint)((int)fVar98 < (int)fVar97) * (int)fVar97 |
                          (uint)((int)fVar98 >= (int)fVar97) * (int)fVar98;
                uVar103 = (uint)((int)fVar88 < (int)fVar99) * (int)fVar99 |
                          (uint)((int)fVar88 >= (int)fVar99) * (int)fVar88;
                uVar78 = (uint)((int)fVar89 < (int)fVar69) * (int)fVar69 |
                         (uint)((int)fVar89 >= (int)fVar69) * (int)fVar89;
                uVar83 = (uint)((int)fVar94 < (int)fVar77) * (int)fVar77 |
                         (uint)((int)fVar94 >= (int)fVar77) * (int)fVar94;
                uVar85 = (uint)((int)fVar73 < (int)fVar82) * (int)fVar82 |
                         (uint)((int)fVar73 >= (int)fVar82) * (int)fVar73;
                uVar87 = (uint)((int)fVar76 < (int)fVar84) * (int)fVar84 |
                         (uint)((int)fVar76 >= (int)fVar84) * (int)fVar76;
                uVar78 = ((int)uVar100 < (int)uVar78) * uVar100 |
                         ((int)uVar100 >= (int)uVar78) * uVar78;
                uVar83 = ((int)uVar101 < (int)uVar83) * uVar101 |
                         ((int)uVar101 >= (int)uVar83) * uVar83;
                uVar85 = ((int)uVar102 < (int)uVar85) * uVar102 |
                         ((int)uVar102 >= (int)uVar85) * uVar85;
                uVar87 = ((int)uVar103 < (int)uVar87) * uVar103 |
                         ((int)uVar103 >= (int)uVar87) * uVar87;
                uVar100 = (uint)((int)fVar90 < (int)fVar53) * (int)fVar53 |
                          (uint)((int)fVar90 >= (int)fVar53) * (int)fVar90;
                uVar101 = (uint)((int)fVar96 < (int)fVar62) * (int)fVar62 |
                          (uint)((int)fVar96 >= (int)fVar62) * (int)fVar96;
                uVar102 = (uint)((int)fVar65 < (int)fVar71) * (int)fVar71 |
                          (uint)((int)fVar65 >= (int)fVar71) * (int)fVar65;
                uVar103 = (uint)((int)fVar66 < (int)fVar86) * (int)fVar86 |
                          (uint)((int)fVar66 >= (int)fVar86) * (int)fVar66;
                uVar78 = ((int)uVar78 < (int)uVar100) * uVar78 |
                         ((int)uVar78 >= (int)uVar100) * uVar100;
                uVar83 = ((int)uVar83 < (int)uVar101) * uVar83 |
                         ((int)uVar83 >= (int)uVar101) * uVar101;
                uVar85 = ((int)uVar85 < (int)uVar102) * uVar85 |
                         ((int)uVar85 >= (int)uVar102) * uVar102;
                uVar87 = ((int)uVar87 < (int)uVar103) * uVar87 |
                         ((int)uVar87 >= (int)uVar103) * uVar103;
                uVar78 = -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar81._0_4_) *
                                         auVar81._0_4_ |
                                        (uint)(tray.tnear.field_0.i[0] >= (int)auVar81._0_4_) *
                                        tray.tnear.field_0.i[0]) <=
                                (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar78) *
                                        tray.tfar.field_0.i[0] |
                                       (tray.tfar.field_0.i[0] >= (int)uVar78) * uVar78));
                uVar83 = -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar81._4_4_) *
                                         auVar81._4_4_ |
                                        (uint)(tray.tnear.field_0.i[1] >= (int)auVar81._4_4_) *
                                        tray.tnear.field_0.i[1]) <=
                                (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar83) *
                                        tray.tfar.field_0.i[1] |
                                       (tray.tfar.field_0.i[1] >= (int)uVar83) * uVar83));
                uVar85 = -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar81._8_4_) *
                                         auVar81._8_4_ |
                                        (uint)(tray.tnear.field_0.i[2] >= (int)auVar81._8_4_) *
                                        tray.tnear.field_0.i[2]) <=
                                (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar85) *
                                        tray.tfar.field_0.i[2] |
                                       (tray.tfar.field_0.i[2] >= (int)uVar85) * uVar85));
                uVar87 = -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar81._12_4_) *
                                         auVar81._12_4_ |
                                        (uint)(tray.tnear.field_0.i[3] >= (int)auVar81._12_4_) *
                                        tray.tnear.field_0.i[3]) <=
                                (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar87) *
                                        tray.tfar.field_0.i[3] |
                                       (tray.tfar.field_0.i[3] >= (int)uVar87) * uVar87));
                aVar114 = _DAT_01f45a30;
              }
              auVar47._0_4_ = (uVar78 & -(uint)bVar16) << 0x1f;
              auVar47._4_4_ = (uVar83 & -(uint)bVar7) << 0x1f;
              auVar47._8_4_ = (uVar85 & -(uint)bVar8) << 0x1f;
              auVar47._12_4_ = (uVar87 & -(uint)bVar9) << 0x1f;
              uVar78 = movmskps((int)valid_i,auVar47);
              valid_i = (vint<4> *)(ulong)uVar78;
              if (uVar78 == 0) {
                auVar57._4_4_ = fStack_1944;
                auVar57._0_4_ = local_1948;
                auVar57._8_4_ = fStack_1940;
                auVar57._12_4_ = fStack_193c;
                sVar1 = root.ptr;
              }
              else {
                auVar57 = blendvps((undefined1  [16])aVar114,auVar81,auVar47);
                if (root.ptr != 8) {
                  pNVar30->ptr = root.ptr;
                  pNVar30 = pNVar30 + 1;
                  paVar29->v[0] = local_1948;
                  paVar29->v[1] = fStack_1944;
                  paVar29->v[2] = fStack_1940;
                  paVar29->v[3] = fStack_193c;
                  paVar29 = paVar29 + 1;
                }
              }
              root.ptr = sVar1;
              local_1948 = auVar57._0_4_;
              fStack_1944 = auVar57._4_4_;
              fStack_1940 = auVar57._8_4_;
              fStack_193c = auVar57._12_4_;
            }
            if (root.ptr == 8) goto LAB_006d31a7;
            auVar48._4_4_ = -(uint)(fStack_1944 < tray.tfar.field_0.v[1]);
            auVar48._0_4_ = -(uint)(local_1948 < tray.tfar.field_0.v[0]);
            auVar48._8_4_ = -(uint)(fStack_1940 < tray.tfar.field_0.v[2]);
            auVar48._12_4_ = -(uint)(fStack_193c < tray.tfar.field_0.v[3]);
            uVar17 = movmskps((int)uVar20,auVar48);
            puVar18 = (undefined1 *)(ulong)(uint)POPCOUNT(uVar17);
          } while ((byte)pRVar26 < (byte)POPCOUNT(uVar17));
          pNVar30->ptr = root.ptr;
          pNVar30 = pNVar30 + 1;
          paVar29->v[0] = local_1948;
          paVar29->v[1] = fStack_1944;
          paVar29->v[2] = fStack_1940;
          paVar29->v[3] = fStack_193c;
          paVar29 = paVar29 + 1;
LAB_006d31a7:
          puVar18 = &DAT_00000004;
        }
        else {
          while (uVar24 != 0) {
            k = (RayQueryContext *)0x0;
            if (uVar24 != 0) {
              for (; (uVar24 >> (long)k & 1) == 0; k = (RayQueryContext *)((long)&k->scene + 1)) {
              }
            }
            uVar24 = uVar24 & uVar24 - 1;
            pRVar25 = k;
            valid_i = (vint<4> *)This;
            bVar16 = occluded1(This,bvh,root,(size_t)k,&pre,ray,&tray,context);
            if (bVar16) {
              terminated.field_0.i[(long)k] = -1;
            }
          }
          iVar31 = movmskps((int)pRVar25,(undefined1  [16])terminated.field_0);
          puVar18 = (undefined1 *)0x3;
          local_1948 = vVar12.field_0._0_4_;
          fStack_1944 = vVar12.field_0._4_4_;
          fStack_1940 = vVar12.field_0._8_4_;
          fStack_193c = vVar12.field_0._12_4_;
          if (iVar31 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            puVar18 = (undefined1 *)0x2;
          }
          uVar24 = 0;
          pRVar25 = pRVar19;
          aVar114 = _DAT_01f45a30;
          if (pRVar26 < pRVar19) goto LAB_006d2bad;
        }
        paVar28 = paVar29;
      } while ((int)puVar18 != 3);
LAB_006d334e:
      auVar50._0_4_ = auVar55._0_4_ & terminated.field_0.i[0];
      auVar50._4_4_ = auVar55._4_4_ & terminated.field_0.i[1];
      auVar50._8_4_ = auVar55._8_4_ & terminated.field_0.i[2];
      auVar50._12_4_ = auVar55._12_4_ & terminated.field_0.i[3];
      auVar63 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar50);
      *(undefined1 (*) [16])(ray + 0x80) = auVar63;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }